

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O3

FSerializer * Serialize(FSerializer *arc,char *key,FSpotList *list,FSpotList *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    pFVar2 = Serialize<PClassActor>(arc,"type",&list->Type,(PClassActor **)0x0);
    pFVar2 = Serialize<ASpecialSpot*,ASpecialSpot*>
                       (pFVar2,"spots",&list->Spots,(TArray<ASpecialSpot_*,_ASpecialSpot_*> *)0x0);
    pFVar2 = Serialize(pFVar2,"index",&list->Index,(uint32_t *)0x0);
    pFVar2 = Serialize(pFVar2,"skipcount",&list->SkipCount,(int32_t *)0x0);
    pFVar2 = Serialize(pFVar2,"numcalls",&list->numcalls,(int32_t *)0x0);
    FSerializer::EndObject(pFVar2);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FSpotList &list, FSpotList *def)
{
	if (arc.BeginObject(key))
	{
		arc("type", list.Type)
			("spots", list.Spots)
			("index", list.Index)
			("skipcount", list.SkipCount)
			("numcalls", list.numcalls)
			.EndObject();
	}
	return arc;
}